

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O2

void Acec_ManPrintRanks(Vec_Int_t *vPairs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p;
  uint uVar6;
  int nCapMin;
  uint uVar7;
  long lVar5;
  
  p = Vec_IntStart(100);
  uVar6 = 0;
  uVar7 = 0;
  while( true ) {
    if (vPairs->nSize <= (int)(uVar6 | 1)) {
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      for (uVar6 = 1; uVar6 - uVar7 != 1; uVar6 = uVar6 + 1) {
        uVar3 = Vec_IntEntry(p,uVar6);
        printf("%2d=%2d ",(ulong)uVar6,(ulong)uVar3);
      }
      putchar(10);
      Vec_IntFree(p);
      return;
    }
    Vec_IntEntry(vPairs,uVar6);
    uVar3 = Vec_IntEntry(vPairs,uVar6 | 1);
    iVar4 = p->nSize;
    if (iVar4 <= (int)uVar3) {
      iVar1 = uVar3 + 1;
      iVar2 = p->nCap * 2;
      nCapMin = iVar1;
      if ((iVar2 <= (int)uVar3) || (nCapMin = iVar2, p->nCap <= (int)uVar3)) {
        Vec_IntGrow(p,nCapMin);
        iVar4 = p->nSize;
      }
      for (lVar5 = (long)iVar4; lVar5 < iVar1; lVar5 = lVar5 + 1) {
        p->pArray[lVar5] = 0;
      }
      p->nSize = iVar1;
      iVar4 = iVar1;
    }
    if (((int)uVar3 < 0) || (iVar4 <= (int)uVar3)) break;
    p->pArray[uVar3] = p->pArray[uVar3] + 1;
    if ((int)uVar3 < (int)uVar7) {
      uVar3 = uVar7;
    }
    uVar6 = uVar6 + 2;
    uVar7 = uVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Acec_ManPrintRanks( Vec_Int_t * vPairs )
{
    int k, iObj, Count, Rank, RankMax = 0;
    Vec_Int_t * vCounts = Vec_IntStart( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, Rank, k )
    {
        Vec_IntFillExtra( vCounts, Rank+1, 0 );
        Vec_IntAddToEntry( vCounts, Rank, 1 );
        RankMax = Abc_MaxInt( RankMax, Rank );
    }
    Vec_IntForEachEntryStartStop( vCounts, Count, Rank, 1, RankMax+1 )
        printf( "%2d=%2d ", Rank, Count );
    printf( "\n" );
    Vec_IntFree( vCounts );
}